

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BendStamp.cpp
# Opt level: O1

void __thiscall OpenMD::BendStamp::~BendStamp(BendStamp *this)

{
  ~BendStamp(this);
  operator_delete(this,0xf0);
  return;
}

Assistant:

BendStamp::~BendStamp() {}